

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O1

string * L_O_G_NS_GET_TIME::get_time_abi_cxx11_(void)

{
  long lVar1;
  ostream oVar2;
  tm *ptVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  ostream *poVar5;
  string *in_RDI;
  ostream *poVar6;
  _Put_time<char> __f;
  time_t time;
  stringstream ss;
  char local_1b9;
  long local_1b8;
  stringstream local_1b0 [16];
  basic_ostream<char,_std::char_traits<char>_> local_1a0 [112];
  ios_base local_130 [264];
  
  local_1b8 = std::chrono::_V2::system_clock::now();
  local_1b8 = local_1b8 / 1000000000;
  std::__cxx11::stringstream::stringstream(local_1b0);
  ptVar3 = localtime(&local_1b8);
  __f._M_fmt = "%Y-%m-%d %H:%M:%S";
  __f._M_tmb = (tm *)ptVar3;
  pbVar4 = std::operator<<(local_1a0,__f);
  local_1b9 = '.';
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)pbVar4,&local_1b9,1);
  lVar1 = *(long *)poVar5;
  *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 3;
  lVar1 = *(long *)(lVar1 + -0x18);
  poVar6 = poVar5 + lVar1;
  if (poVar5[lVar1 + 0xe1] == (ostream)0x0) {
    oVar2 = (ostream)std::ios::widen((char)poVar6);
    poVar6[0xe0] = oVar2;
    poVar6[0xe1] = (ostream)0x1;
  }
  poVar6[0xe0] = (ostream)0x30;
  std::ostream::_M_insert<long>((long)poVar5);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return in_RDI;
}

Assistant:

static inline std::string get_time() {
  auto now = std::chrono::system_clock::now();
  std::time_t time = std::chrono::system_clock::to_time_t(now);
  auto ms = std::chrono::duration_cast<std::chrono::milliseconds>(now.time_since_epoch()) % 1000;
  std::stringstream ss;
  ss << std::put_time(std::localtime(&time), "%Y-%m-%d %H:%M:%S") << '.' << std::setw(3) << std::setfill('0') << ms.count();
  return ss.str();
}